

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highs_c_api.cpp
# Opt level: O3

HighsInt Highs_passMip(void *highs,HighsInt num_col,HighsInt num_row,HighsInt num_nz,
                      HighsInt a_format,HighsInt sense,double offset,double *col_cost,
                      double *col_lower,double *col_upper,double *row_lower,double *row_upper,
                      HighsInt *a_start,HighsInt *a_index,double *a_value,HighsInt *integrality)

{
  HighsStatus HVar1;
  
  HVar1 = Highs::passModel((Highs *)highs,num_col,num_row,num_nz,a_format,sense,offset,col_cost,
                           col_lower,col_upper,row_lower,row_upper,a_start,a_index,a_value,
                           integrality);
  return HVar1;
}

Assistant:

HighsInt Highs_passMip(void* highs, const HighsInt num_col,
                       const HighsInt num_row, const HighsInt num_nz,
                       const HighsInt a_format, const HighsInt sense,
                       const double offset, const double* col_cost,
                       const double* col_lower, const double* col_upper,
                       const double* row_lower, const double* row_upper,
                       const HighsInt* a_start, const HighsInt* a_index,
                       const double* a_value, const HighsInt* integrality) {
  return (HighsInt)((Highs*)highs)
      ->passModel(num_col, num_row, num_nz, a_format, sense, offset, col_cost,
                  col_lower, col_upper, row_lower, row_upper, a_start, a_index,
                  a_value, integrality);
}